

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void SpiritKarma(void)

{
  _Setprecision _Var1;
  ostream *poVar2;
  rep rVar3;
  ResultType *local_1418;
  char *beg;
  result_type i;
  uint _i;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  uniform_int_distribution<int> local_13e8;
  uniform_int_distribution<int> _dist;
  random_device _rdev;
  int _imax;
  int _imin;
  ResultType _result;
  char buf [64];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"spirit karma");
  poVar2 = std::operator<<(poVar2,"... ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  std::random_device::random_device((random_device *)&_dist);
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_13e8,-0x80000000,0x7fffffff);
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&i,
             (duration<double,_std::ratio<1L,_1L>_> *)&_imax);
  for (beg._4_4_ = 0; beg._4_4_ < 10000000; beg._4_4_ = beg._4_4_ + 1) {
    beg._0_4_ = std::uniform_int_distribution<int>::operator()(&local_13e8,(random_device *)&_dist);
    local_1418 = &_result;
    boost::spirit::karma::generate<char*,boost::spirit::terminal<boost::spirit::tag::auto_>,int>
              ((char **)&local_1418,(terminal<boost::spirit::tag::auto_> *)&boost::spirit::auto_,
               (int *)&beg);
    *(undefined1 *)&local_1418->__r = 0;
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&i);
  std::random_device::~random_device((random_device *)&_dist);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  _Var1 = std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&_imax);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SpiritKarma()
{
    char buf[64];
    RANDOM_PROFILING_BEGIN("spirit karma")
    char *beg = buf;
    boost::spirit::karma::generate(beg, boost::spirit::karma::auto_, i);
    *beg = 0;
    RANDOM_PROFILING_END()
}